

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::ClearNodeVector
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->Size != 0) {
    lVar1 = 0x10;
    uVar2 = 0;
    do {
      if (*(long *)((long)this->Nodes + lVar1 + -0x10) != 1) {
        TArray<FUDMFKey,_FUDMFKey>::~TArray
                  ((TArray<FUDMFKey,_FUDMFKey> *)((long)&this->Nodes->Next + lVar1));
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x28;
    } while (uVar2 < this->Size);
  }
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}